

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_md.c
# Opt level: O3

EVP_MD * GOST_init_digest(GOST_digest *d)

{
  char *name;
  int iVar1;
  EVP_MD *pEVar2;
  char *data;
  uint uVar3;
  _func_int_EVP_MD_CTX_ptr *p_Var4;
  _func_int_EVP_MD_CTX_ptr_void_ptr_size_t *p_Var5;
  _func_int_EVP_MD_CTX_ptr_uchar_ptr *p_Var6;
  _func_int_EVP_MD_CTX_ptr_EVP_MD_CTX_ptr *p_Var7;
  _func_int_EVP_MD_CTX_ptr_int_int_void_ptr *p_Var8;
  
  if (d->digest != (EVP_MD *)0x0) {
    return d->digest;
  }
  pEVar2 = (EVP_MD *)EVP_MD_meth_new(d->nid,0);
  if (pEVar2 != (EVP_MD *)0x0) {
    iVar1 = d->result_size;
    if (iVar1 == 0) {
      if (d->template == (gost_digest_st *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = d->template->result_size;
      }
    }
    iVar1 = EVP_MD_meth_set_result_size(pEVar2,iVar1);
    if (iVar1 != 0) {
      iVar1 = d->input_blocksize;
      if (iVar1 == 0) {
        if (d->template == (gost_digest_st *)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = d->template->input_blocksize;
        }
      }
      iVar1 = EVP_MD_meth_set_input_blocksize(pEVar2,iVar1);
      if (iVar1 != 0) {
        iVar1 = d->app_datasize;
        if (iVar1 == 0) {
          if (d->template == (gost_digest_st *)0x0) {
            iVar1 = 0;
          }
          else {
            iVar1 = d->template->app_datasize;
          }
        }
        iVar1 = EVP_MD_meth_set_app_datasize(pEVar2,iVar1);
        if (iVar1 != 0) {
          if (d->template == (gost_digest_st *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = d->template->flags;
          }
          iVar1 = EVP_MD_meth_set_flags(pEVar2,(long)(int)(uVar3 | d->flags));
          if (iVar1 != 0) {
            p_Var4 = d->init;
            if (p_Var4 == (_func_int_EVP_MD_CTX_ptr *)0x0) {
              if (d->template == (gost_digest_st *)0x0) {
                p_Var4 = (_func_int_EVP_MD_CTX_ptr *)0x0;
              }
              else {
                p_Var4 = d->template->init;
              }
            }
            iVar1 = EVP_MD_meth_set_init(pEVar2,p_Var4);
            if (iVar1 != 0) {
              p_Var5 = d->update;
              if (p_Var5 == (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0) {
                if (d->template == (gost_digest_st *)0x0) {
                  p_Var5 = (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0;
                }
                else {
                  p_Var5 = d->template->update;
                }
              }
              iVar1 = EVP_MD_meth_set_update(pEVar2,p_Var5);
              if (iVar1 != 0) {
                p_Var6 = d->final;
                if (p_Var6 == (_func_int_EVP_MD_CTX_ptr_uchar_ptr *)0x0) {
                  if (d->template == (gost_digest_st *)0x0) {
                    p_Var6 = (_func_int_EVP_MD_CTX_ptr_uchar_ptr *)0x0;
                  }
                  else {
                    p_Var6 = d->template->final;
                  }
                }
                iVar1 = EVP_MD_meth_set_final(pEVar2,p_Var6);
                if (iVar1 != 0) {
                  p_Var7 = d->copy;
                  if (p_Var7 == (_func_int_EVP_MD_CTX_ptr_EVP_MD_CTX_ptr *)0x0) {
                    if (d->template == (gost_digest_st *)0x0) {
                      p_Var7 = (_func_int_EVP_MD_CTX_ptr_EVP_MD_CTX_ptr *)0x0;
                    }
                    else {
                      p_Var7 = d->template->copy;
                    }
                  }
                  iVar1 = EVP_MD_meth_set_copy(pEVar2,p_Var7);
                  if (iVar1 != 0) {
                    p_Var4 = d->cleanup;
                    if (p_Var4 == (_func_int_EVP_MD_CTX_ptr *)0x0) {
                      if (d->template == (gost_digest_st *)0x0) {
                        p_Var4 = (_func_int_EVP_MD_CTX_ptr *)0x0;
                      }
                      else {
                        p_Var4 = d->template->cleanup;
                      }
                    }
                    iVar1 = EVP_MD_meth_set_cleanup(pEVar2,p_Var4);
                    if (iVar1 != 0) {
                      p_Var8 = d->ctrl;
                      if (p_Var8 == (_func_int_EVP_MD_CTX_ptr_int_int_void_ptr *)0x0) {
                        if (d->template == (gost_digest_st *)0x0) {
                          p_Var8 = (_func_int_EVP_MD_CTX_ptr_int_int_void_ptr *)0x0;
                        }
                        else {
                          p_Var8 = d->template->ctrl;
                        }
                      }
                      iVar1 = EVP_MD_meth_set_ctrl(pEVar2,p_Var8);
                      if (iVar1 != 0) {
                        name = d->alias;
                        if (name != (char *)0x0) {
                          data = (char *)EVP_MD_get0_name(pEVar2);
                          OBJ_NAME_add(name,0x8001,data);
                        }
                        goto LAB_00118aff;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  EVP_MD_meth_free(pEVar2);
  pEVar2 = (EVP_MD *)0x0;
LAB_00118aff:
  d->digest = pEVar2;
  return pEVar2;
}

Assistant:

EVP_MD *GOST_init_digest(GOST_digest *d)
{
    if (d->digest)
        return d->digest;

    EVP_MD *md;
    if (!(md = EVP_MD_meth_new(d->nid, NID_undef))
        || !EVP_MD_meth_set_result_size(md, TPL(d, result_size))
        || !EVP_MD_meth_set_input_blocksize(md, TPL(d, input_blocksize))
        || !EVP_MD_meth_set_app_datasize(md, TPL(d, app_datasize))
        || !EVP_MD_meth_set_flags(md, d->flags | TPL_VAL(d, flags))
        || !EVP_MD_meth_set_init(md, TPL(d, init))
        || !EVP_MD_meth_set_update(md, TPL(d, update))
        || !EVP_MD_meth_set_final(md, TPL(d, final))
        || !EVP_MD_meth_set_copy(md, TPL(d, copy))
        || !EVP_MD_meth_set_cleanup(md, TPL(d, cleanup))
        || !EVP_MD_meth_set_ctrl(md, TPL(d, ctrl))) {
        EVP_MD_meth_free(md);
        md = NULL;
    }
    if (md && d->alias)
        EVP_add_digest_alias(EVP_MD_name(md), d->alias);
    d->digest = md;
    return md;
}